

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  Options *options_;
  Driver d;
  string local_718;
  vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>
  local_6f8;
  Parse local_6e0;
  Driver local_588;
  
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_718,"Verona","");
  options_ = verona::options();
  verona::parser();
  verona::passes();
  trieste::Driver::Driver(&local_588,&local_718,&options_->super_Options,&local_6e0,&local_6f8);
  CLI::std::
  vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>::
  ~vector(&local_6f8);
  trieste::Parse::~Parse(&local_6e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  iVar1 = trieste::Driver::run(&local_588,argc,argv);
  trieste::Driver::~Driver(&local_588);
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
  trieste::Driver d(
    "Verona", &verona::options(), verona::parser(), verona::passes());

  return d.run(argc, argv);
}